

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_utils.c
# Opt level: O1

int qc_nblockque_get(QcNBlockQue *nblckQ,void **pptr)

{
  void *pvVar1;
  int iVar2;
  uint cell;
  char *str;
  
  if (nblckQ->with_rwlock != 0) {
    qc_thread_mutex_lock(nblckQ->mutex);
  }
  iVar2 = qc_staticlist_count(&nblckQ->lst_used);
  if (iVar2 == 0) {
    iVar2 = -99;
  }
  else {
    cell = qc_staticlist_get_head(&nblckQ->lst_used);
    if ((int)cell < 0) {
      str = "error happend when get from usedlst";
      iVar2 = 0x16b;
    }
    else {
      pvVar1 = *(void **)((long)nblckQ->buff + (ulong)cell * 8);
      iVar2 = qc_staticlist_add_tail(&nblckQ->lst_free,cell);
      if (-1 < iVar2) {
        if (nblckQ->with_rwlock != 0) {
          qc_thread_mutex_unlock(nblckQ->mutex);
        }
        *pptr = pvVar1;
        return iVar2;
      }
      str = "error happend when add tail to freelst";
      iVar2 = 0x177;
    }
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
              ,iVar2,str);
    iVar2 = -1;
  }
  if (nblckQ->with_rwlock != 0) {
    qc_thread_mutex_unlock(nblckQ->mutex);
  }
  return iVar2;
}

Assistant:

int qc_nblockque_get(QcNBlockQue *nblckQ, void **pptr)
{
	int index;
	void *data, **pp_data;

	if (nblckQ->with_rwlock)
		qc_thread_mutex_lock(nblckQ->mutex);

	if (0 == qc_staticlist_count(&nblckQ->lst_used))
	{
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);

		return QC_INVALID_INT;
	}

	index = qc_staticlist_get_head(&nblckQ->lst_used);
	if (index < 0)
	{
		qc_error("error happend when get from usedlst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	pp_data = nblckQ->buff;
	data = pp_data[index];

	index = qc_staticlist_add_tail(&nblckQ->lst_free, index);
	if (index < 0)
	{
		qc_error("error happend when add tail to freelst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	if (nblckQ->with_rwlock)
		qc_thread_mutex_unlock(nblckQ->mutex);

	*pptr = data;
	return index;
}